

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

EVP_PKEY_CTX * EVP_PKEY_CTX_dup(EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_METHOD *pEVar1;
  ENGINE *pEVar2;
  EVP_PKEY *pEVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  pointer peVar7;
  unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter> local_20;
  UniquePtr<EVP_PKEY_CTX> ret;
  EVP_PKEY_CTX *ctx_local;
  
  if ((*(long *)ctx == 0) || (*(long *)(*(long *)ctx + 0x10) == 0)) {
    ctx_local = (EVP_PKEY_CTX *)0x0;
  }
  else {
    ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_ctx_st,_bssl::internal::Deleter,_true,_true>)ctx;
    peVar7 = (pointer)OPENSSL_zalloc(0x30);
    std::unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_ctx_st,bssl::internal::Deleter> *)&local_20,peVar7);
    bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
    if (bVar5) {
      pEVar1 = *(EVP_PKEY_METHOD **)
                ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl;
      peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::operator->(&local_20);
      peVar7->pmeth = pEVar1;
      pEVar2 = *(ENGINE **)
                ((long)ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 8);
      peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::operator->(&local_20);
      peVar7->engine = pEVar2;
      iVar6 = *(int *)((long)ret._M_t.
                             super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x20);
      peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::operator->(&local_20);
      peVar7->operation = iVar6;
      if (*(long *)((long)ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x10) != 0)
      {
        EVP_PKEY_up_ref(*(EVP_PKEY **)
                         ((long)ret._M_t.
                                super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x10)
                       );
        pEVar3 = *(EVP_PKEY **)
                  ((long)ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x10);
        peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::operator->(&local_20);
        peVar7->pkey = pEVar3;
      }
      if (*(long *)((long)ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x18) != 0)
      {
        EVP_PKEY_up_ref(*(EVP_PKEY **)
                         ((long)ret._M_t.
                                super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x18)
                       );
        pEVar3 = *(EVP_PKEY **)
                  ((long)ret._M_t.super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl + 0x18);
        peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::operator->(&local_20);
        peVar7->peerkey = pEVar3;
      }
      pcVar4 = *(code **)(*(long *)ret._M_t.
                                   super___uniq_ptr_impl<evp_pkey_ctx_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_ctx_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_evp_pkey_ctx_st_*,_false>._M_head_impl +
                         0x10);
      peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::get(&local_20);
      iVar6 = (*pcVar4)(peVar7);
      if (iVar6 < 1) {
        peVar7 = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::operator->(&local_20);
        peVar7->pmeth = (EVP_PKEY_METHOD *)0x0;
        ERR_put_error(6,0,6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                      ,0x88);
        ctx_local = (EVP_PKEY_CTX *)0x0;
      }
      else {
        ctx_local = std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::release(&local_20);
      }
    }
    else {
      ctx_local = (EVP_PKEY_CTX *)0x0;
    }
    std::unique_ptr<evp_pkey_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  }
  return (EVP_PKEY_CTX *)ctx_local;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_dup(EVP_PKEY_CTX *ctx) {
  if (!ctx->pmeth || !ctx->pmeth->copy) {
    return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY_CTX> ret(
      reinterpret_cast<EVP_PKEY_CTX *>(OPENSSL_zalloc(sizeof(EVP_PKEY_CTX))));
  if (!ret) {
    return nullptr;
  }

  ret->pmeth = ctx->pmeth;
  ret->engine = ctx->engine;
  ret->operation = ctx->operation;

  if (ctx->pkey != nullptr) {
    EVP_PKEY_up_ref(ctx->pkey);
    ret->pkey = ctx->pkey;
  }

  if (ctx->peerkey != nullptr) {
    EVP_PKEY_up_ref(ctx->peerkey);
    ret->peerkey = ctx->peerkey;
  }

  if (ctx->pmeth->copy(ret.get(), ctx) <= 0) {
    ret->pmeth = nullptr;
    OPENSSL_PUT_ERROR(EVP, ERR_LIB_EVP);
    return nullptr;
  }

  return ret.release();
}